

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void computeYMD(DateTime *p)

{
  undefined1 auVar1 [16];
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  double dVar6;
  
  if (p->validYMD != '\0') {
    return;
  }
  if (p->validJD == '\0') {
    iVar5 = 1;
    iVar4 = 2000;
    iVar2 = 1;
  }
  else {
    auVar1 = SEXT816(p->iJD + 43200000) * SEXT816(0x636ba875fd33dc87);
    iVar4 = (int)(auVar1._8_8_ >> 0x19) - (auVar1._12_4_ >> 0x1f);
    iVar2 = (int)(((double)iVar4 + -1867216.25) / 36524.25);
    iVar5 = iVar2 + 3;
    if (-1 < iVar2) {
      iVar5 = iVar2;
    }
    iVar2 = ((iVar4 + iVar2) - (iVar5 >> 2)) + 0x5f5;
    uVar3 = (uint)(((double)iVar2 + -122.1) / 365.25);
    iVar2 = iVar2 - ((uVar3 & 0x7fff) * 0x8ead) / 100;
    dVar6 = (double)iVar2 / 30.6001;
    iVar5 = (int)dVar6;
    iVar2 = iVar2 - (int)((double)(int)dVar6 * 30.6001);
    iVar5 = (-(uint)(iVar5 < 0xe) | 0xfffffff3) + iVar5;
    iVar4 = (2 < iVar5 ^ 0xffffed95) + uVar3;
  }
  p->Y = iVar4;
  p->M = iVar5;
  p->D = iVar2;
  p->validYMD = '\x01';
  return;
}

Assistant:

static void computeYMD(DateTime *p){
  int Z, A, B, C, D, E, X1;
  if( p->validYMD ) return;
  if( !p->validJD ){
    p->Y = 2000;
    p->M = 1;
    p->D = 1;
  }else{
    assert( validJulianDay(p->iJD) );
    Z = (int)((p->iJD + 43200000)/86400000);
    A = (int)((Z - 1867216.25)/36524.25);
    A = Z + 1 + A - (A/4);
    B = A + 1524;
    C = (int)((B - 122.1)/365.25);
    D = (36525*(C&32767))/100;
    E = (int)((B-D)/30.6001);
    X1 = (int)(30.6001*E);
    p->D = B - D - X1;
    p->M = E<14 ? E-1 : E-13;
    p->Y = p->M>2 ? C - 4716 : C - 4715;
  }
  p->validYMD = 1;
}